

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pObject)

{
  int iVar1;
  char *local_40;
  char *key;
  JlDataObject *object;
  JlDictionaryItem *enumerator;
  JlDataObject **ppJStack_20;
  JL_STATUS jlStatus;
  JlDataObject **pObject_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  enumerator._4_4_ = JL_STATUS_SUCCESS;
  object = (JlDataObject *)0x0;
  if (((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) ||
     (pObject == (JlDataObject **)0x0)) {
    enumerator._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pObject = (JlDataObject *)0x0;
    ppJStack_20 = pObject;
    pObject_local = (JlDataObject **)KeyName;
    KeyName_local = (char *)DictionaryObject;
    do {
      if (enumerator._4_4_ != JL_STATUS_SUCCESS) goto LAB_00102c83;
      key = (char *)0x0;
      local_40 = (char *)0x0;
      enumerator._4_4_ =
           JlGetObjectDictionaryNextItem
                     ((JlDataObject *)KeyName_local,(JlDataObject **)&key,&local_40,
                      (JlDictionaryItem **)&object);
    } while ((enumerator._4_4_ != JL_STATUS_SUCCESS) ||
            (iVar1 = strcmp(local_40,(char *)pObject_local), iVar1 != 0));
    *ppJStack_20 = (JlDataObject *)key;
LAB_00102c83:
    if (enumerator._4_4_ == JL_STATUS_END_OF_DATA) {
      enumerator._4_4_ = JL_STATUS_NOT_FOUND;
    }
  }
  return enumerator._4_4_;
}

Assistant:

JL_STATUS
    JlGetObjectFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JlDictionaryItem* enumerator = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pObject )
    {
        *pObject = NULL;

        while( JL_STATUS_SUCCESS == jlStatus )
        {
            JlDataObject* object = NULL;
            char const* key = NULL;

            jlStatus = JlGetObjectDictionaryNextItem( DictionaryObject, &object, &key, &enumerator );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if( strcmp( key, KeyName ) == 0 )
                {
                    // Found
                    *pObject = object;
                    break;
                }
            }
        }

        if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // This means we got to end of dictionary and did not find the key
            jlStatus = JL_STATUS_NOT_FOUND;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}